

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O2

Node * cookmem::PtrAVLTree::balance(Node **stack,int16_t depth)

{
  short sVar1;
  Node *pNVar2;
  Node *pNVar3;
  int16_t iVar4;
  Node *pNVar5;
  int16_t iVar6;
  
  do {
    while( true ) {
      depth = depth + -1;
      pNVar5 = stack[depth];
      pNVar2 = pNVar5->left;
      pNVar3 = pNVar5->right;
      sVar1 = pNVar5->height;
      if (pNVar2 == (Node *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = pNVar2->height;
      }
      if (pNVar3 == (Node *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = pNVar3->height;
      }
      if ((short)(iVar4 - iVar6) < 2) break;
      if (pNVar2->left == (Node *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = pNVar2->left->height;
      }
      if (pNVar2->right == (Node *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = pNVar2->right->height;
      }
      if (iVar4 < iVar6) {
        pNVar5 = doubleWithLeftChild(pNVar5);
      }
      else {
        pNVar5 = rotateWithLeftChild(pNVar5);
      }
LAB_001026c2:
      if (depth == 0) {
        return pNVar5;
      }
      (&stack[(long)depth + -1]->left)[stack[(long)depth + -1]->size <= pNVar5->size] = pNVar5;
    }
    if ((short)(iVar4 - iVar6) < -1) {
      if (pNVar3->right == (Node *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = pNVar3->right->height;
      }
      if (pNVar3->left == (Node *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = pNVar3->left->height;
      }
      if (iVar4 < iVar6) {
        pNVar5 = doubleWithRightChild(pNVar5);
      }
      else {
        pNVar5 = rotateWithRightChild(pNVar5);
      }
      goto LAB_001026c2;
    }
    updateHeight(pNVar5);
    if (depth == 0) {
      return pNVar5;
    }
    if (sVar1 == pNVar5->height) {
      return (Node *)0x0;
    }
  } while( true );
}

Assistant:

inline static Node*
    balance (Node** stack, std::int16_t depth)
    {
        for (;;)
        {
            --depth;
            Node* root = stack[depth];
            Node* left = root->left;
            Node* right = root->right;

            std::int16_t oldHeight = root->height;
            int16_t diff = getHeight (left) - getHeight (right);
            if (diff > 1)
            {
                if (getHeight (left->left) >= getHeight (left->right))
                {
                    root = rotateWithLeftChild (root);
                }
                else
                {
                    root = doubleWithLeftChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else if (diff < -1)
            {
                if (getHeight (right->right) >= getHeight (right->left))
                {
                    root = rotateWithRightChild (root);
                }
                else
                {
                    root = doubleWithRightChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else
            {
                updateHeight (root);
            }

            if (depth == 0)
            {
                return root;
            }

            if (oldHeight == root->height)
                break;
        }
        return nullptr;
    }